

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O0

void flatbuffers::php::PhpGenerator::GenEnum(EnumDef *enum_def,string *code_ptr)

{
  const_iterator code_ptr_00;
  bool bVar1;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *pvVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *dc;
  char *prefix;
  reference ppEVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  EnumVal *local_80;
  EnumVal *ev_1;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_70;
  const_iterator it_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string *local_38;
  string *code;
  EnumVal *ev;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_20;
  const_iterator it;
  string *code_ptr_local;
  EnumDef *enum_def_local;
  
  if (((enum_def->super_Definition).generated & 1U) == 0) {
    it._M_current = (EnumVal **)code_ptr;
    GenComment(&(enum_def->super_Definition).doc_comment,code_ptr,(CommentConfig *)0x0,"");
    BeginEnum((string *)enum_def,(string *)it._M_current);
    pvVar2 = EnumDef::Vals(enum_def);
    local_20._M_current =
         (EnumVal **)
         std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin(pvVar2)
    ;
    while( true ) {
      pvVar2 = EnumDef::Vals(enum_def);
      ev = (EnumVal *)
           std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end(pvVar2)
      ;
      bVar1 = __gnu_cxx::operator!=
                        (&local_20,
                         (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                          *)&ev);
      if (!bVar1) break;
      ppEVar3 = __gnu_cxx::
                __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                ::operator*(&local_20);
      code_ptr_00 = it;
      code = &(*ppEVar3)->name;
      dc = &((EnumVal *)code)->doc_comment;
      prefix = (char *)std::__cxx11::string::c_str();
      GenComment(dc,(string *)code_ptr_00._M_current,(CommentConfig *)0x0,prefix);
      EnumMember(enum_def,(EnumVal *)code,(string *)it._M_current);
      __gnu_cxx::
      __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
      ::operator++(&local_20);
    }
    local_38 = (string *)it._M_current;
    std::__cxx11::string::operator+=((string *)it._M_current,"\n");
    std::operator+(&local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   Indent_abi_cxx11_,"private static $names = array(\n");
    std::__cxx11::string::operator+=(local_38,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    pvVar2 = EnumDef::Vals(enum_def);
    local_70._M_current =
         (EnumVal **)
         std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin(pvVar2)
    ;
    while( true ) {
      pvVar2 = EnumDef::Vals(enum_def);
      ev_1 = (EnumVal *)
             std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end
                       (pvVar2);
      bVar1 = __gnu_cxx::operator!=
                        (&local_70,
                         (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                          *)&ev_1);
      if (!bVar1) break;
      ppEVar3 = __gnu_cxx::
                __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                ::operator*(&local_70);
      local_80 = *ppEVar3;
      std::operator+(&local_180,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Indent_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Indent_abi_cxx11_);
      std::operator+(&local_160,&local_180,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)enum_def);
      std::operator+(&local_140,&local_160,"::");
      std::operator+(&local_120,&local_140,&local_80->name);
      std::operator+(&local_100,&local_120,"=>");
      std::operator+(&local_e0,&local_100,"\"");
      std::operator+(&local_c0,&local_e0,&local_80->name);
      std::operator+(&local_a0,&local_c0,"\",\n");
      std::__cxx11::string::operator+=(local_38,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_180);
      __gnu_cxx::
      __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
      ::operator++(&local_70);
    }
    std::operator+(&local_1a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   Indent_abi_cxx11_,");\n\n");
    std::__cxx11::string::operator+=(local_38,(string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::operator+(&local_1c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   Indent_abi_cxx11_,"public static function Name($e)\n");
    std::__cxx11::string::operator+=(local_38,(string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::operator+(&local_1e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   Indent_abi_cxx11_,"{\n");
    std::__cxx11::string::operator+=(local_38,(string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::operator+(&local_220,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   Indent_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   Indent_abi_cxx11_);
    std::operator+(&local_200,&local_220,"if (!isset(self::$names[$e])) {\n");
    std::__cxx11::string::operator+=(local_38,(string *)&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_220);
    std::operator+(&local_280,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   Indent_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   Indent_abi_cxx11_);
    std::operator+(&local_260,&local_280,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   Indent_abi_cxx11_);
    std::operator+(&local_240,&local_260,"throw new \\Exception();\n");
    std::__cxx11::string::operator+=(local_38,(string *)&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_280);
    std::operator+(&local_2c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   Indent_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   Indent_abi_cxx11_);
    std::operator+(&local_2a0,&local_2c0,"}\n");
    std::__cxx11::string::operator+=(local_38,(string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::operator+(&local_300,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   Indent_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   Indent_abi_cxx11_);
    std::operator+(&local_2e0,&local_300,"return self::$names[$e];\n");
    std::__cxx11::string::operator+=(local_38,(string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_300);
    std::operator+(&local_320,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   Indent_abi_cxx11_,"}\n");
    std::__cxx11::string::operator+=(local_38,(string *)&local_320);
    std::__cxx11::string::~string((string *)&local_320);
    EndEnum((string *)it._M_current);
  }
  return;
}

Assistant:

static void GenEnum(const EnumDef &enum_def, std::string *code_ptr) {
    if (enum_def.generated) return;

    GenComment(enum_def.doc_comment, code_ptr, nullptr);
    BeginEnum(enum_def.name, code_ptr);
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      auto &ev = **it;
      GenComment(ev.doc_comment, code_ptr, nullptr, Indent.c_str());
      EnumMember(enum_def, ev, code_ptr);
    }

    std::string &code = *code_ptr;
    code += "\n";
    code += Indent + "private static $names = array(\n";
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      auto &ev = **it;
      code += Indent + Indent + enum_def.name + "::" + ev.name + "=>" + "\"" +
              ev.name + "\",\n";
    }

    code += Indent + ");\n\n";
    code += Indent + "public static function Name($e)\n";
    code += Indent + "{\n";
    code += Indent + Indent + "if (!isset(self::$names[$e])) {\n";
    code += Indent + Indent + Indent + "throw new \\Exception();\n";
    code += Indent + Indent + "}\n";
    code += Indent + Indent + "return self::$names[$e];\n";
    code += Indent + "}\n";
    EndEnum(code_ptr);
  }